

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ggml.c
# Opt level: O1

void ggml_graph_cpy(ggml_cgraph *src,ggml_cgraph *dst)

{
  ggml_hash_set *hash_set;
  size_t sVar1;
  size_t sVar2;
  long lVar3;
  char *pcVar4;
  int iVar5;
  ulong uVar6;
  
  if (dst->size < src->n_leafs) {
    pcVar4 = "dst->size >= src->n_leafs";
    iVar5 = 0x177b;
  }
  else {
    iVar5 = src->n_nodes;
    if (dst->size < iVar5) {
      pcVar4 = "dst->size >= src->n_nodes";
      iVar5 = 0x177c;
    }
    else if ((dst->visited_hash_set).size < (src->visited_hash_set).size) {
      pcVar4 = "dst->visited_hash_set.size >= src->visited_hash_set.size";
      iVar5 = 0x177d;
    }
    else {
      dst->n_leafs = src->n_leafs;
      dst->n_nodes = iVar5;
      dst->order = src->order;
      iVar5 = src->n_leafs;
      if (0 < (long)iVar5) {
        lVar3 = 0;
        do {
          dst->leafs[lVar3] = src->leafs[lVar3];
          lVar3 = lVar3 + 1;
        } while (iVar5 != lVar3);
      }
      hash_set = &src->visited_hash_set;
      iVar5 = src->n_nodes;
      if (0 < (long)iVar5) {
        lVar3 = 0;
        do {
          dst->nodes[lVar3] = src->nodes[lVar3];
          lVar3 = lVar3 + 1;
        } while (iVar5 != lVar3);
      }
      if (hash_set->size != 0) {
        uVar6 = 0;
        do {
          if (((src->visited_hash_set).used[uVar6 >> 5] >> ((uint)uVar6 & 0x1f) & 1) != 0) {
            ggml_hash_insert(&dst->visited_hash_set,(src->visited_hash_set).keys[uVar6]);
          }
          uVar6 = uVar6 + 1;
        } while (uVar6 < hash_set->size);
      }
      if (dst->grads != (ggml_tensor **)0x0) {
        memset(dst->grads,0,(dst->visited_hash_set).size << 3);
        memset(dst->grad_accs,0,(dst->visited_hash_set).size << 3);
      }
      if (src->grads == (ggml_tensor **)0x0) {
        return;
      }
      if (dst->grads == (ggml_tensor **)0x0) {
        pcVar4 = "dst->grads != NULL";
        iVar5 = 0x1797;
      }
      else if (dst->grad_accs == (ggml_tensor **)0x0) {
        pcVar4 = "dst->grad_accs != NULL";
        iVar5 = 0x1798;
      }
      else {
        iVar5 = src->n_nodes;
        if ((long)iVar5 < 1) {
          return;
        }
        lVar3 = 0;
        while( true ) {
          sVar1 = ggml_hash_find(hash_set,src->nodes[lVar3]);
          sVar2 = ggml_hash_find(&dst->visited_hash_set,dst->nodes[lVar3]);
          if (sVar1 == 0xffffffffffffffff) {
            pcVar4 = "igrad_src != GGML_HASHSET_FULL";
            iVar5 = 0x179d;
            goto LAB_001221fe;
          }
          if (((src->visited_hash_set).used[sVar1 >> 5] >> ((uint)sVar1 & 0x1f) & 1) == 0) break;
          if (sVar2 == 0xffffffffffffffff) {
            pcVar4 = "igrad_dst != GGML_HASHSET_FULL";
            iVar5 = 0x179f;
            goto LAB_001221fe;
          }
          if (((dst->visited_hash_set).used[sVar2 >> 5] >> ((uint)sVar2 & 0x1f) & 1) == 0) {
            pcVar4 = "ggml_bitset_get(dst->visited_hash_set.used, igrad_dst)";
            iVar5 = 0x17a0;
            goto LAB_001221fe;
          }
          dst->grads[sVar2] = src->grads[sVar1];
          dst->grad_accs[sVar2] = src->grad_accs[sVar1];
          lVar3 = lVar3 + 1;
          if (iVar5 == lVar3) {
            return;
          }
        }
        pcVar4 = "ggml_bitset_get(src->visited_hash_set.used, igrad_src)";
        iVar5 = 0x179e;
      }
    }
  }
LAB_001221fe:
  ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]ggml/src/ggml.c",iVar5,
             "GGML_ASSERT(%s) failed",pcVar4);
}

Assistant:

void ggml_graph_cpy(struct ggml_cgraph * src, struct ggml_cgraph * dst) {
    GGML_ASSERT(dst->size >= src->n_leafs);
    GGML_ASSERT(dst->size >= src->n_nodes);
    GGML_ASSERT(dst->visited_hash_set.size >= src->visited_hash_set.size);

    dst->n_leafs = src->n_leafs;
    dst->n_nodes = src->n_nodes;
    dst->order   = src->order;

    for (int i = 0; i < src->n_leafs; ++i) {
        dst->leafs[i] = src->leafs[i];
    }

    for (int i = 0; i < src->n_nodes; ++i) {
        dst->nodes[i] = src->nodes[i];
    }

    for (size_t i = 0; i < src->visited_hash_set.size; ++i) {
        // copy all hashset keys (tensors) that are in use
        if (ggml_bitset_get(src->visited_hash_set.used, i)) {
            ggml_hash_insert(&dst->visited_hash_set, src->visited_hash_set.keys[i]);
        }
    }

    if (dst->grads) {
        memset(dst->grads,     0, dst->visited_hash_set.size*sizeof(struct ggml_tensor *));
        memset(dst->grad_accs, 0, dst->visited_hash_set.size*sizeof(struct ggml_tensor *));
    }
    if (src->grads) {
        GGML_ASSERT(dst->grads     != NULL);
        GGML_ASSERT(dst->grad_accs != NULL);
        for (int i = 0; i < src->n_nodes; ++i) {
            const size_t igrad_src = ggml_hash_find(&src->visited_hash_set, src->nodes[i]);
            const size_t igrad_dst = ggml_hash_find(&dst->visited_hash_set, dst->nodes[i]);

            GGML_ASSERT(igrad_src != GGML_HASHSET_FULL);
            GGML_ASSERT(ggml_bitset_get(src->visited_hash_set.used, igrad_src));
            GGML_ASSERT(igrad_dst != GGML_HASHSET_FULL);
            GGML_ASSERT(ggml_bitset_get(dst->visited_hash_set.used, igrad_dst));

            dst->grads[igrad_dst]     = src->grads[igrad_src];
            dst->grad_accs[igrad_dst] = src->grad_accs[igrad_src];
        }
    }
}